

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisNodeHandlerMvexE(ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x101d,
                  "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x101e,
                  "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
    __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1020,
                  "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if ((instruction->attributes & 0x40) != 0) {
    *index = (ushort)(instruction->raw).field_3.xop.offset;
    return 0x100000;
  }
  __assert_fail("instruction->attributes & (1ULL << 6)",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x1021,
                "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)");
}

Assistant:

static ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    ZYAN_ASSERT(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX);
    ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MVEX);
    *index = instruction->raw.mvex.E;
    return ZYAN_STATUS_SUCCESS;
}